

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O3

int __thiscall ncnn::Padding::load_param(Padding *this,ParamDict *pd)

{
  int iVar1;
  undefined4 extraout_EAX;
  float fVar2;
  undefined1 auVar3 [16];
  
  iVar1 = ParamDict::get(pd,0,0);
  this->top = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->bottom = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->left = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->right = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->type = iVar1;
  fVar2 = ParamDict::get(pd,5,0.0);
  this->value = fVar2;
  auVar3._0_4_ = -(uint)(this->top == -0xe9);
  auVar3._4_4_ = -(uint)(this->bottom == -0xe9);
  auVar3._8_4_ = -(uint)(this->left == -0xe9);
  auVar3._12_4_ = -(uint)(this->right == -0xe9);
  iVar1 = movmskps(extraout_EAX,auVar3);
  if (iVar1 == 0xf) {
    (this->super_Layer).one_blob_only = false;
  }
  return 0;
}

Assistant:

int Padding::load_param(const ParamDict& pd)
{
    top = pd.get(0, 0);
    bottom = pd.get(1, 0);
    left = pd.get(2, 0);
    right = pd.get(3, 0);
    type = pd.get(4, 0);
    value = pd.get(5, 0.f);

    if (top == -233 && bottom == -233 && left == -233 && right == -233)
    {
        one_blob_only = false;
    }

    return 0;
}